

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

_Bool proxy_for_destination(SockAddr *addr,char *hostname,int port,Conf *conf)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  ushort **ppuVar5;
  bool bVar6;
  char *exclude_list;
  int hostname_len;
  int hostip_len;
  char hostip [64];
  int e;
  int s;
  Conf *conf_local;
  int port_local;
  char *hostname_local;
  SockAddr *addr_local;
  
  hostip[0x3c] = '\0';
  hostip[0x3d] = '\0';
  hostip[0x3e] = '\0';
  hostip[0x3f] = '\0';
  hostip[0x38] = '\0';
  hostip[0x39] = '\0';
  hostip[0x3a] = '\0';
  hostip[0x3b] = '\0';
  if ((addr == (SockAddr *)0x0) || (_Var1 = sk_address_is_special_local(addr), !_Var1)) {
    _Var1 = conf_get_bool(conf,0xc);
    if ((_Var1) ||
       ((_Var1 = sk_hostname_is_local(hostname), !_Var1 &&
        ((addr == (SockAddr *)0x0 || (_Var1 = sk_address_is_local(addr), !_Var1)))))) {
      if (addr == (SockAddr *)0x0) {
        exclude_list._4_4_ = 0;
      }
      else {
        sk_getaddr(addr,(char *)&hostname_len,0x40);
        sVar3 = strlen((char *)&hostname_len);
        exclude_list._4_4_ = (int)sVar3;
      }
      sVar3 = strlen(hostname);
      pcVar4 = conf_get_str(conf,10);
      while (pcVar4[(int)hostip._60_4_] != '\0') {
        while( true ) {
          bVar6 = false;
          if (pcVar4[(int)hostip._60_4_] != '\0') {
            ppuVar5 = __ctype_b_loc();
            bVar6 = true;
            if (((*ppuVar5)[(int)(uint)(byte)pcVar4[(int)hostip._60_4_]] & 0x2000) == 0) {
              bVar6 = pcVar4[(int)hostip._60_4_] == ',';
            }
          }
          if (!bVar6) break;
          hostip._60_4_ = hostip._60_4_ + 1;
        }
        if (pcVar4[(int)hostip._60_4_] == '\0') break;
        hostip[0x38] = hostip[0x3c];
        hostip[0x39] = hostip[0x3d];
        hostip[0x3a] = hostip[0x3e];
        hostip[0x3b] = hostip[0x3f];
        while( true ) {
          bVar6 = false;
          if (pcVar4[(int)hostip._56_4_] != '\0') {
            ppuVar5 = __ctype_b_loc();
            bVar6 = true;
            if (((((*ppuVar5)[(int)(uint)(byte)pcVar4[(int)hostip._56_4_]] & 8) == 0) &&
                (bVar6 = true, pcVar4[(int)hostip._56_4_] != '-')) &&
               (bVar6 = true, pcVar4[(int)hostip._56_4_] != '.')) {
              bVar6 = pcVar4[(int)hostip._56_4_] == '*';
            }
          }
          if (!bVar6) break;
          hostip._56_4_ = hostip._56_4_ + 1;
        }
        if (pcVar4[(int)hostip._60_4_] == '*') {
          if (((addr != (SockAddr *)0x0) &&
              (iVar2 = strncasecmp((char *)((long)&hostname_len +
                                           ((long)exclude_list._4_4_ -
                                           (long)((hostip._56_4_ - hostip._60_4_) + -1))),
                                   pcVar4 + (long)(int)hostip._60_4_ + 1,
                                   (long)((hostip._56_4_ - hostip._60_4_) + -1)), iVar2 == 0)) ||
             (iVar2 = strncasecmp(hostname +
                                  ((long)(int)sVar3 - (long)((hostip._56_4_ - hostip._60_4_) + -1)),
                                  pcVar4 + (long)(int)hostip._60_4_ + 1,
                                  (long)((hostip._56_4_ - hostip._60_4_) + -1)), iVar2 == 0)) {
            return false;
          }
        }
        else if (pcVar4[hostip._56_4_ + -1] == '*') {
          if (((addr != (SockAddr *)0x0) &&
              (iVar2 = strncasecmp((char *)&hostname_len,pcVar4 + (int)hostip._60_4_,
                                   (long)((hostip._56_4_ - hostip._60_4_) + -1)), iVar2 == 0)) ||
             (iVar2 = strncasecmp(hostname,pcVar4 + (int)hostip._60_4_,
                                  (long)((hostip._56_4_ - hostip._60_4_) + -1)), iVar2 == 0)) {
            return false;
          }
        }
        else {
          if ((addr != (SockAddr *)0x0) &&
             (iVar2 = strncasecmp((char *)&hostname_len,pcVar4 + (int)hostip._60_4_,
                                  (long)(int)(hostip._56_4_ - hostip._60_4_)), iVar2 == 0)) {
            return false;
          }
          iVar2 = strncasecmp(hostname,pcVar4 + (int)hostip._60_4_,
                              (long)(int)(hostip._56_4_ - hostip._60_4_));
          if (iVar2 == 0) {
            return false;
          }
        }
        hostip[0x3c] = hostip[0x38];
        hostip[0x3d] = hostip[0x39];
        hostip[0x3e] = hostip[0x3a];
        hostip[0x3f] = hostip[0x3b];
        while( true ) {
          bVar6 = false;
          if (pcVar4[(int)hostip._60_4_] != '\0') {
            ppuVar5 = __ctype_b_loc();
            bVar6 = false;
            if (((*ppuVar5)[(int)(uint)(byte)pcVar4[(int)hostip._60_4_]] & 0x2000) == 0) {
              bVar6 = pcVar4[(int)hostip._60_4_] != ',';
            }
          }
          if (!bVar6) break;
          hostip._60_4_ = hostip._60_4_ + 1;
        }
      }
      addr_local._7_1_ = true;
    }
    else {
      addr_local._7_1_ = false;
    }
  }
  else {
    addr_local._7_1_ = false;
  }
  return addr_local._7_1_;
}

Assistant:

static bool proxy_for_destination(SockAddr *addr, const char *hostname,
                                  int port, Conf *conf)
{
    int s = 0, e = 0;
    char hostip[64];
    int hostip_len, hostname_len;
    const char *exclude_list;

    /*
     * Special local connections such as Unix-domain sockets
     * unconditionally cannot be proxied, even in proxy-localhost
     * mode. There just isn't any way to ask any known proxy type for
     * them.
     */
    if (addr && sk_address_is_special_local(addr))
        return false;                  /* do not proxy */

    /*
     * Check the host name and IP against the hard-coded
     * representations of `localhost'.
     */
    if (!conf_get_bool(conf, CONF_even_proxy_localhost) &&
        (sk_hostname_is_local(hostname) ||
         (addr && sk_address_is_local(addr))))
        return false;                  /* do not proxy */

    /* we want a string representation of the IP address for comparisons */
    if (addr) {
        sk_getaddr(addr, hostip, 64);
        hostip_len = strlen(hostip);
    } else
        hostip_len = 0;                /* placate gcc; shouldn't be required */

    hostname_len = strlen(hostname);

    exclude_list = conf_get_str(conf, CONF_proxy_exclude_list);

    /* now parse the exclude list, and see if either our IP
     * or hostname matches anything in it.
     */

    while (exclude_list[s]) {
        while (exclude_list[s] &&
               (isspace((unsigned char)exclude_list[s]) ||
                exclude_list[s] == ',')) s++;

        if (!exclude_list[s]) break;

        e = s;

        while (exclude_list[e] &&
               (isalnum((unsigned char)exclude_list[e]) ||
                exclude_list[e] == '-' ||
                exclude_list[e] == '.' ||
                exclude_list[e] == '*')) e++;

        if (exclude_list[s] == '*') {
            /* wildcard at beginning of entry */

            if ((addr && strnicmp(hostip + hostip_len - (e - s - 1),
                                  exclude_list + s + 1, e - s - 1) == 0) ||
                strnicmp(hostname + hostname_len - (e - s - 1),
                         exclude_list + s + 1, e - s - 1) == 0) {
                /* IP/hostname range excluded. do not use proxy. */
                return false;
            }
        } else if (exclude_list[e-1] == '*') {
            /* wildcard at end of entry */

            if ((addr && strnicmp(hostip, exclude_list + s, e - s - 1) == 0) ||
                strnicmp(hostname, exclude_list + s, e - s - 1) == 0) {
                /* IP/hostname range excluded. do not use proxy. */
                return false;
            }
        } else {
            /* no wildcard at either end, so let's try an absolute
             * match (ie. a specific IP)
             */

            if (addr && strnicmp(hostip, exclude_list + s, e - s) == 0)
                return false; /* IP/hostname excluded. do not use proxy. */
            if (strnicmp(hostname, exclude_list + s, e - s) == 0)
                return false; /* IP/hostname excluded. do not use proxy. */
        }

        s = e;

        /* Make sure we really have reached the next comma or end-of-string */
        while (exclude_list[s] &&
               !isspace((unsigned char)exclude_list[s]) &&
               exclude_list[s] != ',') s++;
    }

    /* no matches in the exclude list, so use the proxy */
    return true;
}